

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O0

void __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::~input_stream_t
          (input_stream_t<cfgfile::string_trait_t> *this)

{
  long in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)0x14c9d0);
  std::__cxx11::string::~string((string *)(in_RDI + 0x68));
  std::
  stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
  ::~stack((stack<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>_>
            *)0x14c9ec);
  return;
}

Assistant:

~input_stream_t()
	{
	}